

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

void DspReverb_Reset(DspReverb *reverb)

{
  long in_RDI;
  int32_t c;
  int32_t i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  undefined4 in_stack_fffffffffffffff4;
  int iVar2;
  
  DspDelay_Reset((DspDelay *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  for (iVar2 = 0; iVar2 < 1; iVar2 = iVar2 + 1) {
    DspAllPass_Reset((DspAllPass *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  }
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 0x50); iVar1 = iVar1 + 1) {
    DspDelay_Reset((DspDelay *)CONCAT44(iVar2,iVar1));
    for (iVar2 = 0; iVar2 < 8; iVar2 = iVar2 + 1) {
      DspCombShelving_Reset((DspCombShelving *)CONCAT44(iVar2,iVar1));
    }
    DspBiQuad_Reset((DspBiQuad *)CONCAT44(iVar2,iVar1));
    for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
      DspAllPass_Reset((DspAllPass *)CONCAT44(iVar2,iVar1));
    }
  }
  return;
}

Assistant:

void DspReverb_Reset(DspReverb *reverb)
{
	int32_t i, c;

	DspDelay_Reset(&reverb->early_delay);

	for (i = 0; i < REVERB_COUNT_APF_IN; ++i)
	{
		DspAllPass_Reset(&reverb->apf_in[i]);
	}

	for (c = 0; c < reverb->reverb_channels; ++c)
	{
		DspDelay_Reset(&reverb->channel[c].reverb_delay);

		for (i = 0; i < REVERB_COUNT_COMB; ++i)
		{
			DspCombShelving_Reset(&reverb->channel[c].lpf_comb[i]);
		}

		DspBiQuad_Reset(&reverb->channel[c].room_high_shelf);

		for (i = 0; i < REVERB_COUNT_APF_OUT; ++i)
		{
			DspAllPass_Reset(&reverb->channel[c].apf_out[i]);
		}
	}
}